

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

void __thiscall IMLE::set_internal_parameters(IMLE *this)

{
  X *xpr;
  Z *xpr_00;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  Index index;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  plainobjectbase_evaluator_data<double,_0> *ppVar12;
  long lVar13;
  char *pcVar14;
  ActualDstType actualDst;
  double dVar15;
  Scalar SVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  double __tmp;
  Scal SVar20;
  double degrees_of_freedom;
  policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  local_51;
  plainobjectbase_evaluator_data<double,_0> local_50;
  plainobjectbase_evaluator_data<double,_0> local_48;
  Scal local_40;
  plainobjectbase_evaluator_data<double,_0> local_38;
  Scalar local_30;
  
  iVar8 = (int)((ulong)((long)(this->experts).
                              super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                              .
                              super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->experts).
                             super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                             .
                             super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x5f02a3a1;
  this->M = iVar8;
  if (iVar8 == 0) {
    lVar13 = (long)this->d;
    SVar20 = (this->param).sigma0;
    if ((this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != lVar13) {
      local_40 = SVar20;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 lVar13,1);
      lVar13 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows;
      SVar20 = local_40;
    }
    auVar7 = _DAT_0018a020;
    auVar6 = _DAT_0018a010;
    if (0 < lVar13) {
      pdVar3 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      uVar10 = lVar13 + 0x1fffffffffffffffU & 0x1fffffffffffffff;
      auVar17._8_4_ = (int)uVar10;
      auVar17._0_8_ = uVar10;
      auVar17._12_4_ = (int)(uVar10 >> 0x20);
      lVar11 = 0;
      auVar17 = auVar17 ^ _DAT_0018a020;
      do {
        auVar18._8_4_ = (int)lVar11;
        auVar18._0_8_ = lVar11;
        auVar18._12_4_ = (int)((ulong)lVar11 >> 0x20);
        auVar18 = (auVar18 | auVar6) ^ auVar7;
        bVar5 = auVar17._0_4_ < auVar18._0_4_;
        iVar8 = auVar17._4_4_;
        iVar19 = auVar18._4_4_;
        if ((bool)(~(iVar8 < iVar19 || iVar19 == iVar8 && bVar5) & 1)) {
          pdVar3[lVar11] = SVar20;
        }
        if (iVar8 >= iVar19 && (iVar19 != iVar8 || !bVar5)) {
          pdVar3[lVar11 + 1] = SVar20;
        }
        lVar11 = lVar11 + 2;
      } while ((uVar10 - ((uint)(lVar13 + 0x1fffffffffffffffU) & 1)) + 2 != lVar11);
    }
    pdVar3 = (this->param).Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    uVar10 = (this->param).Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if ((this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        != uVar10) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar10,
                 1);
      uVar10 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
    }
    pdVar4 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar9 = uVar10 - ((long)uVar10 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar10) {
      lVar13 = 0;
      do {
        pdVar1 = pdVar3 + lVar13;
        dVar15 = pdVar1[1];
        pdVar2 = pdVar4 + lVar13;
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar15;
        lVar13 = lVar13 + 2;
      } while (lVar13 < (long)uVar9);
    }
    if ((long)uVar9 < (long)uVar10) {
      do {
        pdVar4[uVar9] = pdVar3[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
    }
  }
  local_50.data = (double *)(double)this->D;
  if (0x3fe < (uint)((ulong)((long)ABS((double)local_50.data) + -0x10000000000000) >> 0x35) ||
      (long)local_50.data < 0) {
    boost::math::policies::detail::raise_error<std::domain_error,double>
              ("boost::math::chi_squared_distribution<%1%>::chi_squared_distribution",
               "Degrees of freedom argument is %1%, but must be > 0 !",(double *)&local_50);
  }
  local_38.data = (double *)(1.0 - (this->param).p0);
  local_48.data = local_50.data;
  if ((long)local_50.data - 1U < 0xfffffffffffff ||
      -1 < (long)local_50.data &&
      (uint)((long)ABS((double)local_50.data) + 0xfff0000000000000U >> 0x35) < 0x3ff) {
    if (((double)local_38.data < 0.0 || 1.0 < (double)local_38.data) ||
        0x7fefffffffffffff < (long)ABS((double)local_38.data)) {
      pcVar14 = "Probability argument is %1%, but must be >= 0 and <= 1 !";
      ppVar12 = &local_38;
      goto LAB_001457da;
    }
    dVar15 = boost::math::detail::
             gamma_p_inv_imp<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                       ((double)local_50.data * 0.5,(double)local_38.data,&local_51);
    dVar15 = (dVar15 + dVar15) * -0.5;
  }
  else {
    pcVar14 = "Degrees of freedom argument is %1%, but must be > 0 !";
    ppVar12 = &local_48;
LAB_001457da:
    boost::math::policies::detail::raise_error<std::domain_error,double>
              (boost::math::
               quantile<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>(boost::math::chi_squared_distribution<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>const&,double_const&)
               ::function,pcVar14,(double *)ppVar12);
    dVar15 = NAN;
  }
  dVar15 = exp(dVar15);
  this->sig_level_noiseX_rbf = dVar15;
  local_50.data = (double *)(double)this->d;
  if (0x3fe < (uint)((ulong)((long)ABS((double)local_50.data) + -0x10000000000000) >> 0x35) ||
      (long)local_50.data < 0) {
    boost::math::policies::detail::raise_error<std::domain_error,double>
              ("boost::math::chi_squared_distribution<%1%>::chi_squared_distribution",
               "Degrees of freedom argument is %1%, but must be > 0 !",(double *)&local_50);
  }
  local_38.data = (double *)(1.0 - (this->param).p0);
  local_48.data = local_50.data;
  if ((long)local_50.data - 1U < 0xfffffffffffff ||
      -1 < (long)local_50.data &&
      (uint)((long)ABS((double)local_50.data) + 0xfff0000000000000U >> 0x35) < 0x3ff) {
    if (((double)local_38.data < 0.0 || 1.0 < (double)local_38.data) ||
        0x7fefffffffffffff < (long)ABS((double)local_38.data)) {
      pcVar14 = "Probability argument is %1%, but must be >= 0 and <= 1 !";
      ppVar12 = &local_38;
      goto LAB_00145911;
    }
    dVar15 = boost::math::detail::
             gamma_p_inv_imp<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                       ((double)local_50.data * 0.5,(double)local_38.data,&local_51);
    dVar15 = (dVar15 + dVar15) * -0.5;
  }
  else {
    pcVar14 = "Degrees of freedom argument is %1%, but must be > 0 !";
    ppVar12 = &local_48;
LAB_00145911:
    boost::math::policies::detail::raise_error<std::domain_error,double>
              (boost::math::
               quantile<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>(boost::math::chi_squared_distribution<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>const&,double_const&)
               ::function,pcVar14,(double *)ppVar12);
    dVar15 = NAN;
  }
  dVar15 = exp(dVar15);
  this->sig_level_noiseZ_rbf = dVar15;
  local_50.data = (double *)(double)(this->d + this->D);
  if (0x3fe < (uint)((ulong)((long)ABS((double)local_50.data) + -0x10000000000000) >> 0x35) ||
      (long)local_50.data < 0) {
    boost::math::policies::detail::raise_error<std::domain_error,double>
              ("boost::math::chi_squared_distribution<%1%>::chi_squared_distribution",
               "Degrees of freedom argument is %1%, but must be > 0 !",(double *)&local_50);
  }
  local_38.data = (double *)(1.0 - (this->param).p0);
  local_48.data = local_50.data;
  if ((long)local_50.data - 1U < 0xfffffffffffff ||
      -1 < (long)local_50.data &&
      (uint)(((ulong)local_50.data & 0x7fffffffffffffff) + 0xfff0000000000000 >> 0x35) < 0x3ff) {
    if ((0.0 <= (double)local_38.data && (double)local_38.data <= 1.0) &&
        (long)ABS((double)local_38.data) < 0x7ff0000000000000) {
      dVar15 = boost::math::detail::
               gamma_p_inv_imp<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                         ((double)local_50.data * 0.5,(double)local_38.data,&local_51);
      dVar15 = (dVar15 + dVar15) * -0.5;
      goto LAB_00145a56;
    }
    pcVar14 = "Probability argument is %1%, but must be >= 0 and <= 1 !";
    ppVar12 = &local_38;
  }
  else {
    pcVar14 = "Degrees of freedom argument is %1%, but must be > 0 !";
    ppVar12 = &local_48;
  }
  boost::math::policies::detail::raise_error<std::domain_error,double>
            (boost::math::
             quantile<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>(boost::math::chi_squared_distribution<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>const&,double_const&)
             ::function,pcVar14,(double *)ppVar12);
  dVar15 = NAN;
LAB_00145a56:
  dVar15 = exp(dVar15);
  this->sig_level_noiseZX_rbf = dVar15;
  local_40 = this->sig_level_noiseX_rbf;
  xpr = &this->Psi;
  dVar15 = 1.0;
  if ((this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      0) {
    local_48.data =
         (xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar15 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
             ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_48,
                        (scalar_product_op<double,_double> *)&local_50,xpr);
  }
  if (dVar15 < 0.0) {
    dVar15 = sqrt(dVar15);
  }
  else {
    dVar15 = SQRT(dVar15);
  }
  this->pNoiseModelX = local_40 / dVar15;
  local_40 = this->sig_level_noiseZ_rbf;
  xpr_00 = &this->Sigma;
  if ((this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      == 0) {
    dVar15 = 1.0;
  }
  else {
    local_48.data =
         (xpr_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar15 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
             ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_48,
                        (scalar_product_op<double,_double> *)&local_50,xpr_00);
  }
  if (dVar15 < 0.0) {
    dVar15 = sqrt(dVar15);
  }
  else {
    dVar15 = SQRT(dVar15);
  }
  this->pNoiseModelZ = local_40 / dVar15;
  local_40 = this->sig_level_noiseZX_rbf;
  SVar16 = 1.0;
  if ((this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      0) {
    local_48.data =
         (xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    SVar16 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
             ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_48,
                        (scalar_product_op<double,_double> *)&local_50,xpr);
  }
  dVar15 = 1.0;
  if ((this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != 0) {
    local_48.data =
         (xpr_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_30 = SVar16;
    dVar15 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
             ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_48,
                        (scalar_product_op<double,_double> *)&local_50,xpr_00);
    SVar16 = local_30;
  }
  dVar15 = SVar16 * dVar15;
  if (dVar15 < 0.0) {
    dVar15 = sqrt(dVar15);
  }
  else {
    dVar15 = SQRT(dVar15);
  }
  this->pNoiseModelZX = local_40 / dVar15;
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::set_internal_parameters()
{
    // Number of experts
    M = experts.size();

    // Initial guess for hyperparameters
    if( M == 0 )
    {
        Sigma = Z::Constant(d,param.sigma0);  //Template: Z::Constant(param.sigma0)
        Psi = param.Psi0;
    }

    // Significance test level
    sig_level_noiseX_rbf = exp(-0.5* quantile(boost::math::chi_squared(D), 1.0 - param.p0) );
    sig_level_noiseZ_rbf = exp(-0.5* quantile(boost::math::chi_squared(d), 1.0 - param.p0) );
    sig_level_noiseZX_rbf = exp(-0.5* quantile(boost::math::chi_squared(D+d), 1.0 - param.p0) );

    pNoiseModelX = sig_level_noiseX_rbf / sqrt(Psi.prod());
    pNoiseModelZ = sig_level_noiseZ_rbf / sqrt(Sigma.prod());
    pNoiseModelZX = sig_level_noiseZX_rbf/ sqrt(Psi.prod() * Sigma.prod());
}